

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins.c
# Opt level: O2

int nn_ins_bind(nn_ins_item *item,nn_ins_fn fn)

{
  int iVar1;
  int iVar2;
  nn_list_item *pnVar3;
  nn_list_item *pnVar4;
  char *pcVar5;
  char *pcVar6;
  nn_ins_item *self;
  
  nn_mutex_lock(&::self.sync);
  pnVar3 = nn_list_begin(&::self.bound);
  iVar2 = -0x62;
  while( true ) {
    pnVar4 = nn_list_end(&::self.bound);
    if (pnVar3 == pnVar4) break;
    pnVar4 = pnVar3 + -1;
    if (pnVar3 == (nn_list_item *)0x0) {
      pnVar4 = (nn_list_item *)0x0;
    }
    pcVar5 = nn_epbase_getaddr(&item->epbase);
    pcVar6 = nn_epbase_getaddr((nn_epbase *)pnVar4);
    iVar1 = strncmp(pcVar5,pcVar6,0x80);
    if (iVar1 == 0) goto LAB_001201a1;
    pnVar3 = nn_list_next(&::self.bound,pnVar3);
  }
  pnVar3 = nn_list_end(&::self.bound);
  nn_list_insert(&::self.bound,&item->item,pnVar3);
  pnVar3 = nn_list_begin(&::self.connected);
  while( true ) {
    pnVar4 = nn_list_end(&::self.connected);
    if (pnVar3 == pnVar4) break;
    self = (nn_ins_item *)(pnVar3 + -1);
    if (pnVar3 == (nn_list_item *)0x0) {
      self = (nn_ins_item *)0x0;
    }
    pcVar5 = nn_epbase_getaddr(&item->epbase);
    pcVar6 = nn_epbase_getaddr(&self->epbase);
    iVar2 = strncmp(pcVar5,pcVar6,0x80);
    if (iVar2 == 0) {
      iVar2 = nn_epbase_ispeer(&item->epbase,self->protocol);
      if (iVar2 != 0) {
        (*fn)(item,self);
      }
    }
    pnVar3 = nn_list_next(&::self.connected,pnVar3);
  }
  iVar2 = 0;
LAB_001201a1:
  nn_mutex_unlock(&::self.sync);
  return iVar2;
}

Assistant:

int nn_ins_bind (struct nn_ins_item *item, nn_ins_fn fn)
{
    struct nn_list_item *it;
    struct nn_ins_item *bitem;
    struct nn_ins_item *citem;

    nn_mutex_lock (&self.sync);

    /*  Check whether the endpoint isn't already bound. */
    /*  TODO:  This is an O(n) algorithm! */
    for (it = nn_list_begin (&self.bound); it != nn_list_end (&self.bound);
          it = nn_list_next (&self.bound, it)) {
        bitem = nn_cont (it, struct nn_ins_item, item);
        if (strncmp (nn_epbase_getaddr (&item->epbase),
              nn_epbase_getaddr (&bitem->epbase), NN_SOCKADDR_MAX) == 0) {
            nn_mutex_unlock (&self.sync);
            return -EADDRINUSE;
        }
    }

    /*  Insert the entry into the endpoint repository. */
    nn_list_insert (&self.bound, &item->item,
        nn_list_end (&self.bound));

    /*  During this process new pipes may be created. */
    for (it = nn_list_begin (&self.connected);
          it != nn_list_end (&self.connected);
          it = nn_list_next (&self.connected, it)) {
        citem = nn_cont (it, struct nn_ins_item, item);
        if (strncmp (nn_epbase_getaddr (&item->epbase),
              nn_epbase_getaddr (&citem->epbase), NN_SOCKADDR_MAX) == 0) {

            /*  Check whether the two sockets are compatible. */
            if (!nn_epbase_ispeer (&item->epbase, citem->protocol))
                continue;

            fn (item, citem);
        }
    }

    nn_mutex_unlock (&self.sync);

    return 0;
}